

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

__m256 * __thiscall Sphere::intersect(Sphere *this,Ray8 *ray,DiffGeom8 *dg)

{
  uint uVar1;
  __m256 afVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  Vec3f v;
  __m256 t;
  __m256 b_00;
  __m256 a_00;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  __m256 *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  Vec3f_8 normal;
  Vec3f_8 point;
  __m256 in_range;
  __m256 swap_t;
  __m256 hits;
  __m256 t1;
  __m256 t0;
  __m256 c;
  __m256 b;
  __m256 a;
  Vec3f_8 d;
  Vec3f_8 center;
  Vec3f_8 *in_stack_fffffffffffff548;
  Vec3f_8 *b_01;
  undefined4 in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  float in_stack_fffffffffffff568;
  Vec3f_8 *in_stack_fffffffffffff588;
  Vec3f_8 *in_stack_fffffffffffff590;
  undefined8 uVar23;
  undefined1 in_stack_fffffffffffff5c0 [24];
  Ray8 *in_stack_fffffffffffff5e0;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  __m256 *in_stack_fffffffffffff648;
  __m256 *in_stack_fffffffffffff650;
  undefined8 in_stack_fffffffffffff658;
  undefined8 in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  undefined8 in_stack_fffffffffffff670;
  undefined8 in_stack_fffffffffffff678;
  undefined8 in_stack_fffffffffffff680;
  undefined8 in_stack_fffffffffffff688;
  undefined8 in_stack_fffffffffffff690;
  undefined8 in_stack_fffffffffffff698;
  undefined8 in_stack_fffffffffffff6a0;
  undefined8 in_stack_fffffffffffff6a8;
  undefined8 in_stack_fffffffffffff6b0;
  undefined1 local_8e0 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_180;
  Vec3f_8 *pVStack_178;
  Vec3f_8 *pVStack_170;
  undefined8 uStack_168;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  __m256 *pafVar19;
  
  uVar20 = *(undefined8 *)(in_RDI + 8);
  v.z = in_stack_fffffffffffff568;
  v._0_8_ = in_RDI;
  Vec3f_8::Vec3f_8(in_stack_fffffffffffff548,v);
  operator-((Vec3f_8 *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
            in_stack_fffffffffffff548);
  Vec3f_8::length_sqr(in_stack_fffffffffffff590);
  Vec3f_8::dot(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  auVar5 = vinsertps_avx(ZEXT416(0xc0000000),ZEXT416(0xc0000000),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0xc0000000),0x20);
  vinsertps_avx(auVar5,ZEXT416(0xc0000000),0x30);
  auVar5 = vinsertps_avx(ZEXT416(0xc0000000),ZEXT416(0xc0000000),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0xc0000000),0x20);
  vinsertps_avx(auVar5,ZEXT416(0xc0000000),0x30);
  uVar1 = *(uint *)(in_RDI + 0x14);
  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
  auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
  local_180 = auVar5._0_8_;
  pVStack_178 = auVar5._8_8_;
  pVStack_170 = auVar6._0_8_;
  uStack_168 = auVar6._8_8_;
  uVar1 = *(uint *)(in_RDI + 0x14);
  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
  auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
  local_140 = auVar5._0_8_;
  uStack_138 = auVar5._8_8_;
  uStack_130 = auVar6._0_8_;
  uStack_128 = auVar6._8_8_;
  uVar21 = uStack_130;
  uVar23 = uStack_128;
  Vec3f_8::dot(pVStack_170,pVStack_178);
  auVar7._8_8_ = pVStack_178;
  auVar7._0_8_ = local_180;
  auVar7._16_8_ = pVStack_170;
  auVar7._24_8_ = uStack_168;
  auVar4._16_8_ = uStack_130;
  auVar4._0_16_ = auVar5;
  auVar4._24_8_ = uVar23;
  auVar3._8_8_ = uStack_138;
  auVar3._0_8_ = local_140;
  auVar3._16_8_ = uVar21;
  auVar3._24_8_ = uStack_128;
  vfnmadd213ps_fma(auVar4,auVar7,auVar3);
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  local_8e0._0_16_ = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  uStack_f0 = auVar5._0_8_;
  uStack_e8 = auVar5._8_8_;
  local_8e0._16_8_ = uStack_f0;
  local_8e0._24_8_ = uStack_e8;
  auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
  auVar6 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(0),0x20);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(0),0x30);
  uStack_b0 = auVar6._0_8_;
  uStack_a8 = auVar6._8_8_;
  a_00[2] = (float)(int)in_stack_fffffffffffff6a0;
  a_00[3] = (float)(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20);
  a_00[0] = (float)in_stack_fffffffffffff698;
  a_00[1] = SUB84(in_stack_fffffffffffff698,4);
  a_00[4] = (float)(int)in_stack_fffffffffffff6a8;
  a_00[5] = (float)(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
  a_00[6] = (float)(int)in_stack_fffffffffffff6b0;
  a_00[7] = (float)(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20);
  b_00[2] = (float)in_stack_fffffffffffff680;
  b_00[3] = SUB84(in_stack_fffffffffffff680,4);
  b_00[0] = (float)in_stack_fffffffffffff678;
  b_00[1] = SUB84(in_stack_fffffffffffff678,4);
  b_00[4] = (float)in_stack_fffffffffffff688;
  b_00[5] = SUB84(in_stack_fffffffffffff688,4);
  b_00[6] = (float)in_stack_fffffffffffff690;
  b_00[7] = SUB84(in_stack_fffffffffffff690,4);
  afVar2[2] = (float)in_stack_fffffffffffff660;
  afVar2[3] = SUB84(in_stack_fffffffffffff660,4);
  afVar2[0] = (float)in_stack_fffffffffffff658;
  afVar2[1] = SUB84(in_stack_fffffffffffff658,4);
  afVar2[4] = (float)in_stack_fffffffffffff668;
  afVar2[5] = SUB84(in_stack_fffffffffffff668,4);
  afVar2[6] = (float)in_stack_fffffffffffff670;
  afVar2[7] = SUB84(in_stack_fffffffffffff670,4);
  solve_quadratic(a_00,b_00,afVar2,in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  auVar3 = vcmpps_avx(local_8e0,*(undefined1 (*) [32])(in_RSI + 0xc0),1);
  auVar16._16_8_ = uStack_f0;
  auVar16._0_16_ = local_8e0._0_16_;
  auVar16._24_8_ = uStack_e8;
  auVar15._16_8_ = uStack_b0;
  auVar15._0_16_ = auVar5;
  auVar15._24_8_ = uStack_a8;
  auVar3 = vblendvps_avx(auVar16,auVar15,auVar3);
  auVar4 = vcmpps_avx(*(undefined1 (*) [32])(in_RSI + 0xc0),auVar3,1);
  uVar21 = vcmpps_avx512vl(auVar3,*(undefined1 (*) [32])(in_RSI + 0xe0),1);
  auVar7 = vpmovm2d_avx512vl(uVar21);
  auVar4 = vpand_avx2(auVar4,auVar7);
  auVar17._8_8_ = uVar20;
  auVar17._0_8_ = uVar20;
  auVar17._16_8_ = uVar20;
  auVar17._24_8_ = uVar20;
  auVar4 = vpand_avx2(auVar17,auVar4);
  auVar4 = vpand_avx2(auVar4,*(undefined1 (*) [32])(in_RSI + 0x100));
  iVar18 = vmovmskps_avx(auVar4);
  pafVar19 = (__m256 *)CONCAT44((int)((ulong)in_RSI >> 0x20),iVar18);
  if (iVar18 != 0) {
    auVar3 = vblendvps_avx(*(undefined1 (*) [32])(in_RSI + 0xe0),auVar3,auVar4);
    *(undefined1 (*) [32])(in_RSI + 0xe0) = auVar3;
    b_01 = (Vec3f_8 *)local_9c0;
    t[2] = (float)in_stack_fffffffffffff5c0._0_4_;
    t[3] = (float)in_stack_fffffffffffff5c0._4_4_;
    t[4] = (float)in_stack_fffffffffffff5c0._8_4_;
    t[5] = (float)in_stack_fffffffffffff5c0._12_4_;
    t[6] = (float)in_stack_fffffffffffff5c0._16_4_;
    t[7] = (float)in_stack_fffffffffffff5c0._20_4_;
    t[0] = (float)(int)uVar23;
    t[1] = (float)(int)((ulong)uVar23 >> 0x20);
    Ray8::at(in_stack_fffffffffffff5e0,t);
    auVar14._8_8_ = in_stack_fffffffffffff648;
    auVar14._0_4_ = local_9c0[0];
    auVar14._4_4_ = local_9c0[1];
    auVar14._16_8_ = in_stack_fffffffffffff650;
    auVar14._24_4_ = (float)in_stack_fffffffffffff658;
    auVar14._28_4_ = SUB84(in_stack_fffffffffffff658,4);
    afVar2 = (__m256)vblendvps_avx((undefined1  [32])*in_RDX,auVar14,auVar4);
    *in_RDX = afVar2;
    auVar13._8_4_ = (float)in_stack_fffffffffffff668;
    auVar13._12_4_ = SUB84(in_stack_fffffffffffff668,4);
    auVar13._0_4_ = (float)in_stack_fffffffffffff660;
    auVar13._4_4_ = SUB84(in_stack_fffffffffffff660,4);
    auVar13._16_4_ = (float)in_stack_fffffffffffff670;
    auVar13._20_4_ = SUB84(in_stack_fffffffffffff670,4);
    auVar13._24_4_ = (float)in_stack_fffffffffffff678;
    auVar13._28_4_ = SUB84(in_stack_fffffffffffff678,4);
    afVar2 = (__m256)vblendvps_avx((undefined1  [32])in_RDX[1],auVar13,auVar4);
    in_RDX[1] = afVar2;
    auVar12._8_4_ = (float)in_stack_fffffffffffff688;
    auVar12._12_4_ = SUB84(in_stack_fffffffffffff688,4);
    auVar12._0_4_ = (float)in_stack_fffffffffffff680;
    auVar12._4_4_ = SUB84(in_stack_fffffffffffff680,4);
    auVar12._16_4_ = (float)in_stack_fffffffffffff690;
    auVar12._20_4_ = SUB84(in_stack_fffffffffffff690,4);
    auVar12._24_4_ = (float)in_stack_fffffffffffff698;
    auVar12._28_4_ = SUB84(in_stack_fffffffffffff698,4);
    afVar2 = (__m256)vblendvps_avx((undefined1  [32])in_RDX[2],auVar12,auVar4);
    in_RDX[2] = afVar2;
    operator-((Vec3f_8 *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),b_01);
    auVar11._8_8_ = uStack_a18;
    auVar11._0_8_ = in_stack_fffffffffffff5e0;
    auVar11._16_8_ = uStack_a10;
    auVar11._24_8_ = uStack_a08;
    afVar2 = (__m256)vblendvps_avx((undefined1  [32])in_RDX[3],auVar11,auVar4);
    in_RDX[3] = afVar2;
    auVar10._8_8_ = uStack_9f8;
    auVar10._0_8_ = local_a00;
    auVar10._16_8_ = uStack_9f0;
    auVar10._24_8_ = uStack_9e8;
    afVar2 = (__m256)vblendvps_avx((undefined1  [32])in_RDX[4],auVar10,auVar4);
    in_RDX[4] = afVar2;
    auVar9._8_8_ = uStack_9d8;
    auVar9._0_8_ = local_9e0;
    auVar9._16_8_ = uStack_9d0;
    auVar9._24_8_ = uStack_9c8;
    afVar2 = (__m256)vblendvps_avx((undefined1  [32])in_RDX[5],auVar9,auVar4);
    in_RDX[5] = afVar2;
    Vec3f_8::normalize(pVStack_170);
    uVar1 = *(uint *)(in_RDI + 0x18);
    auVar5 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
    auVar5 = vpinsrd_avx(auVar5,uVar1,2);
    auVar5 = vpinsrd_avx(auVar5,uVar1,3);
    auVar6 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
    auVar6 = vpinsrd_avx(auVar6,uVar1,2);
    auVar6 = vpinsrd_avx(auVar6,uVar1,3);
    auVar22 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
    uStack_70 = auVar22._0_8_;
    uStack_68 = auVar22._8_8_;
    auVar8._16_8_ = uStack_70;
    auVar8._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
    auVar8._24_8_ = uStack_68;
    auVar3 = vblendvps_avx((undefined1  [32])in_RDX[6],auVar8,auVar4);
    local_240 = auVar3._0_8_;
    uStack_238 = auVar3._8_8_;
    uStack_230 = auVar3._16_8_;
    uStack_228 = auVar3._24_8_;
    *(undefined8 *)in_RDX[6] = local_240;
    *(undefined8 *)(in_RDX[6] + 2) = uStack_238;
    *(undefined8 *)(in_RDX[6] + 4) = uStack_230;
    *(undefined8 *)(in_RDX[6] + 6) = uStack_228;
    pafVar19 = in_RDX;
  }
  return pafVar19;
}

Assistant:

__m256 Sphere::intersect(Ray8 &ray, DiffGeom8 &dg) const {
	const auto center = Vec3f_8{pos};
	const auto d = center - ray.o;
	const auto a = ray.d.length_sqr();
	const auto b = _mm256_mul_ps(ray.d.dot(d), _mm256_set1_ps(-2.f));
	const auto c = _mm256_fnmadd_ps(_mm256_set1_ps(radius), _mm256_set1_ps(radius), d.dot(d));
	// Solve the quadratic equation and store the mask of potential hits
	// We'll update this mask as we discard other potential hits, eg. due to
	// the hit being beyond the ray's t value
	auto t0 = _mm256_set1_ps(0);
	auto t1 = _mm256_set1_ps(0);
	auto hits = solve_quadratic(a, b, c, t0, t1);
	// We want t0 to hold the nearest t value that is greater than ray.t_min
	auto swap_t = _mm256_cmp_ps(t0, ray.t_min, _CMP_LT_OQ);
	t0 = _mm256_blendv_ps(t0, t1, swap_t);
	// Check which hits are within the ray's t range
	auto in_range = _mm256_and_ps(_mm256_cmp_ps(t0, ray.t_min, _CMP_GT_OQ),
			_mm256_cmp_ps(t0, ray.t_max, _CMP_LT_OQ));
	hits = _mm256_and_ps(hits, in_range);
	hits = _mm256_and_ps(hits, ray.active);
	// Check if all rays miss the sphere
	if (_mm256_movemask_ps(hits) == 0){
		return hits;
	}
	// Update t values for rays that did hit
	ray.t_max = _mm256_blendv_ps(ray.t_max, t0, hits);

	const auto point = ray.at(ray.t_max);
	dg.point.x = _mm256_blendv_ps(dg.point.x, point.x, hits);
	dg.point.y = _mm256_blendv_ps(dg.point.y, point.y, hits);
	dg.point.z = _mm256_blendv_ps(dg.point.z, point.z, hits);
	const auto normal = point - center;
	dg.normal.x = _mm256_blendv_ps(dg.normal.x, normal.x, hits);
	dg.normal.y = _mm256_blendv_ps(dg.normal.y, normal.y, hits);
	dg.normal.z = _mm256_blendv_ps(dg.normal.z, normal.z, hits);
	dg.normal.normalize();
	// There's no blendv_epi32 in AVX/AVX2 so we have to resort to some hacky casting
	dg.material_id = _mm256_castps_si256(_mm256_blendv_ps(_mm256_castsi256_ps(dg.material_id),
			_mm256_castsi256_ps(_mm256_set1_epi32(material_id)), hits));
	return hits;
}